

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Histogram
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  byte *pbVar1;
  uint uVar2;
  pointer __s;
  pointer puVar3;
  uchar *puVar4;
  uint32_t uVar5;
  ulong uVar6;
  uchar *puVar7;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  if (image->_rowSize == width) {
    uVar5 = 1;
    if (width < (uint)(0xffffffff / (ulong)height)) {
      uVar5 = height;
      height = 1;
    }
    width = width * uVar5;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(histogram,0x100);
  __s = (histogram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar3 = (histogram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar3) {
    memset(__s,0,((long)puVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  uVar2 = image->_rowSize;
  if (height * uVar2 != 0) {
    puVar4 = image->_data + (ulong)x + (ulong)(y * uVar2);
    puVar7 = puVar4 + height * uVar2;
    do {
      if (width != 0) {
        uVar6 = 0;
        do {
          pbVar1 = puVar4 + uVar6;
          uVar6 = uVar6 + 1;
          __s[*pbVar1] = __s[*pbVar1] + 1;
        } while (width != uVar6);
      }
      puVar4 = puVar4 + uVar2;
    } while (puVar4 != puVar7);
  }
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector < uint32_t > & histogram )
    {
        ParameterValidation( image, x, y, width, height );
        VerifyGrayScaleImage( image );
        OptimiseRoi( width, height, image );

        histogram.resize( 256u );
        std::fill( histogram.begin(), histogram.end(), 0u );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX )
                ++histogram[*imageX];
        }
    }